

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O0

CURLcode http_range(Curl_easy *data,Curl_HttpReq httpreq)

{
  char *pcVar1;
  long local_38;
  curl_off_t total_len;
  curl_off_t req_clen;
  Curl_HttpReq httpreq_local;
  Curl_easy *data_local;
  
  if ((*(uint *)&(data->state).field_0x7be >> 10 & 1) != 0) {
    if (((httpreq == HTTPREQ_GET) || (httpreq == HTTPREQ_HEAD)) &&
       (pcVar1 = Curl_checkheaders(data,"Range",5), pcVar1 == (char *)0x0)) {
      (*Curl_cfree)((data->state).aptr.rangeline);
      pcVar1 = curl_maprintf("Range: bytes=%s\r\n",(data->state).range);
      (data->state).aptr.rangeline = pcVar1;
    }
    else if (((httpreq == HTTPREQ_POST) || (httpreq == HTTPREQ_PUT)) &&
            (pcVar1 = Curl_checkheaders(data,"Content-Range",0xd), pcVar1 == (char *)0x0)) {
      local_38 = Curl_creader_total_length(data);
      (*Curl_cfree)((data->state).aptr.rangeline);
      if ((data->set).set_resume_from < 0) {
        pcVar1 = curl_maprintf("Content-Range: bytes 0-%ld/%ld\r\n",local_38 + -1,local_38);
        (data->state).aptr.rangeline = pcVar1;
      }
      else if ((data->state).resume_from == 0) {
        pcVar1 = curl_maprintf("Content-Range: bytes %s/%ld\r\n",(data->state).range,local_38);
        (data->state).aptr.rangeline = pcVar1;
      }
      else {
        if ((*(uint *)&(data->req).field_0xd1 >> 0x12 & 1) == 0) {
          local_38 = (data->state).resume_from + local_38;
        }
        else {
          local_38 = (data->state).infilesize;
        }
        pcVar1 = curl_maprintf("Content-Range: bytes %s%ld/%ld\r\n",(data->state).range,
                               local_38 + -1,local_38);
        (data->state).aptr.rangeline = pcVar1;
      }
      if ((data->state).aptr.rangeline == (char *)0x0) {
        return CURLE_OUT_OF_MEMORY;
      }
    }
  }
  return CURLE_OK;
}

Assistant:

static CURLcode http_range(struct Curl_easy *data,
                           Curl_HttpReq httpreq)
{
  if(data->state.use_range) {
    /*
     * A range is selected. We use different headers whether we are downloading
     * or uploading and we always let customized headers override our internal
     * ones if any such are specified.
     */
    if(((httpreq == HTTPREQ_GET) || (httpreq == HTTPREQ_HEAD)) &&
       !Curl_checkheaders(data, STRCONST("Range"))) {
      /* if a line like this was already allocated, free the previous one */
      free(data->state.aptr.rangeline);
      data->state.aptr.rangeline = aprintf("Range: bytes=%s\r\n",
                                           data->state.range);
    }
    else if((httpreq == HTTPREQ_POST || httpreq == HTTPREQ_PUT) &&
            !Curl_checkheaders(data, STRCONST("Content-Range"))) {
      curl_off_t req_clen = Curl_creader_total_length(data);
      /* if a line like this was already allocated, free the previous one */
      free(data->state.aptr.rangeline);

      if(data->set.set_resume_from < 0) {
        /* Upload resume was asked for, but we do not know the size of the
           remote part so we tell the server (and act accordingly) that we
           upload the whole file (again) */
        data->state.aptr.rangeline =
          aprintf("Content-Range: bytes 0-%" FMT_OFF_T "/%" FMT_OFF_T "\r\n",
                  req_clen - 1, req_clen);

      }
      else if(data->state.resume_from) {
        /* This is because "resume" was selected */
        /* Not sure if we want to send this header during authentication
         * negotiation, but test1084 checks for it. In which case we have a
         * "null" client reader installed that gives an unexpected length. */
        curl_off_t total_len = data->req.authneg ?
                               data->state.infilesize :
                               (data->state.resume_from + req_clen);
        data->state.aptr.rangeline =
          aprintf("Content-Range: bytes %s%" FMT_OFF_T "/%" FMT_OFF_T "\r\n",
                  data->state.range, total_len-1, total_len);
      }
      else {
        /* Range was selected and then we just pass the incoming range and
           append total size */
        data->state.aptr.rangeline =
          aprintf("Content-Range: bytes %s/%" FMT_OFF_T "\r\n",
                  data->state.range, req_clen);
      }
      if(!data->state.aptr.rangeline)
        return CURLE_OUT_OF_MEMORY;
    }
  }
  return CURLE_OK;
}